

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int json_object_update(json_t *object,json_t *other)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  json_t *local_30;
  json_t *value;
  char *key;
  json_t *other_local;
  json_t *object_local;
  
  if ((((object != (json_t *)0x0) && (object->type == JSON_OBJECT)) && (other != (json_t *)0x0)) &&
     (other->type == JSON_OBJECT)) {
    pvVar2 = json_object_iter(other);
    value = (json_t *)json_object_iter_key(pvVar2);
    while( true ) {
      bVar3 = false;
      if (value != (json_t *)0x0) {
        pvVar2 = json_object_key_to_iter((char *)value);
        local_30 = json_object_iter_value(pvVar2);
        bVar3 = local_30 != (json_t *)0x0;
      }
      if (!bVar3) {
        return 0;
      }
      iVar1 = json_object_set_nocheck(object,(char *)value,local_30);
      if (iVar1 != 0) break;
      pvVar2 = json_object_key_to_iter((char *)value);
      pvVar2 = json_object_iter_next(other,pvVar2);
      value = (json_t *)json_object_iter_key(pvVar2);
    }
  }
  return -1;
}

Assistant:

int json_object_update(json_t *object, json_t *other)
{
	const char *key;
	json_t *value;

	if (!json_is_object(object) || !json_is_object(other))
		return -1;

	json_object_foreach(other, key, value) {
		if (json_object_set_nocheck(object, key, value))
			return -1;
	}

	return 0;
}